

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_keeper.h
# Opt level: O1

void __thiscall mp::ConstraintManager::ComputeViolations(ConstraintManager *this,SolCheck *chk)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->con_keepers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->con_keepers_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(*(long *)p_Var1[1]._M_parent + 0x120))(p_Var1[1]._M_parent,chk);
  }
  return;
}

Assistant:

void ComputeViolations(SolCheck& chk) {
    for (const auto& ck: con_keepers_)
      ck.second.ComputeViolations(chk);
  }